

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O1

bool uWS::WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
     consumeMessage<8u,unsigned_short>
               (unsigned_short payLength,char **src,uint *length,WebSocketState<true> *wState,
               void *user)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  char *pcVar7;
  OpCode OVar8;
  bool bVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  
  bVar1 = *(byte *)&wState->state;
  OVar8 = **src & 0xf;
  if (OVar8 == 0) {
    if ((bVar1 & 0x60) == 0x60) goto LAB_00143237;
  }
  else {
    if (((bVar1 & 0x60) == 0x20) || (OVar8 == TEXT && -1 < (char)bVar1)) goto LAB_00143237;
    bVar11 = (bVar1 >> 5) + 1;
    *(byte *)&wState->state = bVar1 & 0x9f | (bVar11 & 3) << 5;
    (wState->state).opCode[(long)((ulong)bVar11 << 0x3e) >> 0x3e] = OVar8;
  }
  *(byte *)&wState->state = *(byte *)&wState->state & 0x7f | **src & 0x80U;
  us_socket_context(0,user);
  lVar10 = us_socket_context_ext(0);
  if ((ulong)payLength <= *(ulong *)(lVar10 + 0xa0)) {
    uVar12 = payLength + 8;
    if (*length < uVar12) {
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe0;
      wState->remainingBytes = ((uint)payLength - *length) + 8;
      bVar1 = **src;
      *(undefined4 *)wState->mask = *(undefined4 *)(*src + 4);
      pcVar7 = *src;
      uVar12 = *length;
      lVar10 = 0;
      do {
        pcVar7[lVar10 * 4] = wState->mask[0] ^ pcVar7[lVar10 * 4 + 8];
        pcVar7[lVar10 * 4 + 1] = wState->mask[1] ^ pcVar7[lVar10 * 4 + 9];
        pcVar7[lVar10 * 4 + 2] = wState->mask[2] ^ pcVar7[lVar10 * 4 + 10];
        pcVar7[lVar10 * 4 + 3] = wState->mask[3] ^ pcVar7[lVar10 * 4 + 0xb];
        lVar10 = lVar10 + 1;
      } while ((uVar12 - 8 >> 2) + 1 != (int)lVar10);
      uVar12 = *length;
      cVar2 = wState->mask[1];
      cVar3 = wState->mask[2];
      cVar4 = wState->mask[3];
      wState->mask[-uVar12 & 3] = wState->mask[0];
      wState->mask[1 - uVar12 & 3] = cVar2;
      wState->mask[(ulong)(-uVar12 & 3) ^ 2] = cVar3;
      wState->mask[~uVar12 & 3] = cVar4;
      WebSocketContext<false,_true>::handleFragment
                (*src,(ulong)(*length - 8),wState->remainingBytes,
                 (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                 (bool)(bVar1 >> 7),wState,user);
      return true;
    }
    pcVar7 = *src;
    bVar1 = pcVar7[4];
    bVar11 = pcVar7[5];
    bVar5 = pcVar7[6];
    bVar6 = pcVar7[7];
    lVar10 = 0;
    do {
      pcVar7[lVar10 * 4 + 4] = pcVar7[lVar10 * 4 + 8] ^ bVar1;
      pcVar7[lVar10 * 4 + 5] = pcVar7[lVar10 * 4 + 9] ^ bVar11;
      pcVar7[lVar10 * 4 + 6] = pcVar7[lVar10 * 4 + 10] ^ bVar5;
      pcVar7[lVar10 * 4 + 7] = pcVar7[lVar10 * 4 + 0xb] ^ bVar6;
      lVar10 = lVar10 + 1;
    } while ((payLength >> 2) + 1 != (int)lVar10);
    bVar9 = WebSocketContext<false,_true>::handleFragment
                      (*src + 4,(ulong)payLength,0,
                       (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                       (bool)((byte)**src >> 7),wState,user);
    if (!bVar9) {
      if (**src < '\0') {
        *(byte *)&wState->state =
             *(byte *)&wState->state & 0x9f | *(byte *)&wState->state + 0x60 & 0x60;
      }
      *src = *src + uVar12;
      *length = *length - uVar12;
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe1;
      return false;
    }
    return true;
  }
LAB_00143237:
  us_socket_close(0,user);
  return true;
}

Assistant:

static inline bool consumeMessage(T payLength, char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (getOpCode(src)) {
            if (wState->state.opStack == 1 || (!wState->state.lastFin && getOpCode(src) < 2)) {
                Impl::forceClose(wState, user);
                return true;
            }
            wState->state.opCode[++wState->state.opStack] = (OpCode) getOpCode(src);
        } else if (wState->state.opStack == -1) {
            Impl::forceClose(wState, user);
            return true;
        }
        wState->state.lastFin = isFin(src);

        if (Impl::refusePayloadLength(payLength, wState, user)) {
            Impl::forceClose(wState, user);
            return true;
        }

        if (payLength + MESSAGE_HEADER <= length) {
            if (isServer) {
                unmaskImpreciseCopyMask(src + MESSAGE_HEADER - 4, src + MESSAGE_HEADER, src + MESSAGE_HEADER - 4, (unsigned int) payLength);
                if (Impl::handleFragment(src + MESSAGE_HEADER - 4, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            } else {
                if (Impl::handleFragment(src + MESSAGE_HEADER, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            }

            if (isFin(src)) {
                wState->state.opStack--;
            }

            src += payLength + MESSAGE_HEADER;
            length -= (unsigned int) (payLength + MESSAGE_HEADER);
            wState->state.spillLength = 0;
            return false;
        } else {
            wState->state.spillLength = 0;
            wState->state.wantsHead = false;
            wState->remainingBytes = (unsigned int) (payLength - length + MESSAGE_HEADER);
            bool fin = isFin(src);
            if (isServer) {
                memcpy(wState->mask, src + MESSAGE_HEADER - 4, 4);
                unmaskImprecise(src, src + MESSAGE_HEADER, wState->mask, length - MESSAGE_HEADER);
                rotateMask(4 - (length - MESSAGE_HEADER) % 4, wState->mask);
            } else {
                src += MESSAGE_HEADER;
            }
            Impl::handleFragment(src, length - MESSAGE_HEADER, wState->remainingBytes, wState->state.opCode[wState->state.opStack], fin, wState, user);
            return true;
        }
    }